

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

QModelIndex * __thiscall
QAbstractItemViewPrivate::indexForEditor(QAbstractItemViewPrivate *this,QWidget *editor)

{
  long lVar1;
  bool bVar2;
  long in_RSI;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  const_iterator it;
  QWidget **in_stack_ffffffffffffffa8;
  QModelIndex *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar2 = QHash<QPersistentModelIndex,_QEditorInfo>::isEmpty
                    ((QHash<QPersistentModelIndex,_QEditorInfo> *)(in_RSI + 0x348));
  if (bVar2) {
    QModelIndex::QModelIndex((QModelIndex *)0x802580);
  }
  else {
    QHash<QWidget_*,_QPersistentModelIndex>::find
              ((QHash<QWidget_*,_QPersistentModelIndex> *)in_RDI,in_stack_ffffffffffffffa8);
    QHash<QWidget_*,_QPersistentModelIndex>::end((QHash<QWidget_*,_QPersistentModelIndex> *)this_00)
    ;
    bVar2 = QHash<QWidget_*,_QPersistentModelIndex>::const_iterator::operator==
                      ((const_iterator *)this_00,(const_iterator *)in_RDI);
    if (bVar2) {
      QModelIndex::QModelIndex((QModelIndex *)0x8025f7);
    }
    else {
      QHash<QWidget_*,_QPersistentModelIndex>::const_iterator::value((const_iterator *)0x802603);
      QPersistentModelIndex::operator_cast_to_QModelIndex((QPersistentModelIndex *)in_RDI);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

QModelIndex QAbstractItemViewPrivate::indexForEditor(QWidget *editor) const
{
    // do not try to search to avoid slow implicit cast from QModelIndex to QPersistentModelIndex
    if (indexEditorHash.isEmpty())
        return QModelIndex();

   QEditorIndexHash::const_iterator it = editorIndexHash.find(editor);
    if (it == editorIndexHash.end())
        return QModelIndex();

    return it.value();
}